

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_shmtx.c
# Opt level: O0

void ngx_shmtx_lock(ngx_shmtx_t *mtx)

{
  bool bVar1;
  ulong local_20;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_shmtx_t *mtx_local;
  
  if ((ngx_cycle->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"shmtx lock");
  }
  do {
    if (*mtx->lock == 0) {
      LOCK();
      bVar1 = *mtx->lock == 0;
      if (bVar1) {
        *mtx->lock = (long)ngx_pid;
      }
      UNLOCK();
      if (bVar1) {
        return;
      }
    }
    if (1 < ngx_ncpu) {
      for (local_20 = 1; local_20 < mtx->spin; local_20 = local_20 << 1) {
        for (n = 0; n < local_20; n = n + 1) {
        }
        if (*mtx->lock == 0) {
          LOCK();
          bVar1 = *mtx->lock == 0;
          if (bVar1) {
            *mtx->lock = (long)ngx_pid;
          }
          UNLOCK();
          if (bVar1) {
            return;
          }
        }
      }
    }
    sched_yield();
  } while( true );
}

Assistant:

void
ngx_shmtx_lock(ngx_shmtx_t *mtx)
{
    ngx_uint_t         i, n;

    ngx_log_debug0(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0, "shmtx lock");

    for ( ;; ) {

        if (*mtx->lock == 0 && ngx_atomic_cmp_set(mtx->lock, 0, ngx_pid)) {
            return;
        }

        if (ngx_ncpu > 1) {

            for (n = 1; n < mtx->spin; n <<= 1) {

                for (i = 0; i < n; i++) {
                    ngx_cpu_pause();
                }

                if (*mtx->lock == 0
                    && ngx_atomic_cmp_set(mtx->lock, 0, ngx_pid))
                {
                    return;
                }
            }
        }

#if (NGX_HAVE_POSIX_SEM)

        if (mtx->semaphore) {
            (void) ngx_atomic_fetch_add(mtx->wait, 1);

            if (*mtx->lock == 0 && ngx_atomic_cmp_set(mtx->lock, 0, ngx_pid)) {
                (void) ngx_atomic_fetch_add(mtx->wait, -1);
                return;
            }

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0,
                           "shmtx wait %uA", *mtx->wait);

            while (sem_wait(&mtx->sem) == -1) {
                ngx_err_t  err;

                err = ngx_errno;

                if (err != NGX_EINTR) {
                    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, err,
                                  "sem_wait() failed while waiting on shmtx");
                    break;
                }
            }

            ngx_log_debug0(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0,
                           "shmtx awoke");

            continue;
        }

#endif

        ngx_sched_yield();
    }
}